

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  _Bool _Var1;
  DecodeStatus DVar2;
  long in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  undefined2 *in_R8;
  DecodeStatus Result;
  uint32_t insn32;
  uint16_t insn16;
  uint32_t local_40;
  uint16_t local_3a [5];
  undefined2 *local_30;
  long local_28;
  size_t local_20;
  uint8_t *local_18;
  _Bool local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  _Var1 = readInstruction16(in_RSI,in_RDX,local_3a);
  if (_Var1) {
    if (*(long *)(*(long *)(local_28 + 0x310) + 0xf0) != 0) {
      memset(*(void **)(*(long *)(local_28 + 0x310) + 0xf0),0,0xdc);
    }
    DVar2 = decodeInstruction_2((uint8_t *)code_len,MI,size._6_2_,address,_insn32,Result);
    if (DVar2 == MCDisassembler_Fail) {
      _Var1 = readInstruction32(local_18,local_20,&local_40);
      if (_Var1) {
        DVar2 = decodeInstruction_4((uint8_t *)ud,(MCInst *)code,code_len._4_4_,(uint64_t)MI,
                                    (MCRegisterInfo *)size,address._4_4_);
        if (DVar2 == MCDisassembler_Fail) {
          local_1 = false;
        }
        else {
          *local_30 = 4;
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      *local_30 = 2;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return false;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, xcore)+sizeof(cs_xcore));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return true;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return false;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}